

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O3

void __thiscall iDynTree::Visualizer::draw(Visualizer *this)

{
  iDynTree::reportError
            ("Visualizer","draw",
             "Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht."
            );
  return;
}

Assistant:

void Visualizer::draw()
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !pimpl->m_isInitialized )
    {
        reportError("Visualizer","draw","Impossible to run not initialized visualizer");
        return;
    }

    if (!pimpl->m_subDrawStarted)
    {
        int winWidth = width();
        int winHeight = height();

        if (winHeight <= 0)
        {
            return;
        }

#ifdef IDYNTREE_USE_GLFW_WINDOW
        glfwMakeContextCurrent(pimpl->m_window);
#endif

        pimpl->m_irrDriver->beginScene(true,true, pimpl->m_environment.m_backgroundColor.toSColor(), pimpl->m_irrVideoData);

        pimpl->m_irrDriver->setViewPort(irr::core::rect<irr::s32>(0, 0, winWidth, winHeight));

        pimpl->m_irrDriver->OnResize(irr::core::dimension2d<irr::u32>(winWidth, winHeight));

        pimpl->m_textures.draw(pimpl->m_environment, pimpl->m_camera, true);

        pimpl->m_camera.setWindowDimensions(winWidth, winHeight);

        pimpl->m_irrSmgr->drawAll();
    }

    pimpl->m_irrDriver->endScene();
    pimpl->m_subDrawStarted = false;

#ifdef IDYNTREE_USE_GLFW_WINDOW
    glfwSwapBuffers(pimpl->m_window);

    glfwPollEvents();
#endif

    int fps = pimpl->m_irrDriver->getFPS();

    if (pimpl->lastFPS != fps)
    {
        irr::core::stringw str = L"iDynTree Visualizer [";
        str += pimpl->m_irrDriver->getName();
        str += "] FPS:";
        str += fps;
        str += " ";
        irr::core::stringc strc(str);

        pimpl->m_irrDevice->setWindowCaption(str.c_str());
#ifdef IDYNTREE_USE_GLFW_WINDOW
        glfwSetWindowTitle(pimpl->m_window, strc.c_str());
#endif
        pimpl->lastFPS = fps;
    }

#else
    reportError("Visualizer","draw","Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht.");
#endif
}